

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

void io_writex(CPUArchState_conflict30 *env,CPUIOTLBEntry *iotlbentry,int mmu_idx,uint64_t val,
              target_ulong_conflict addr,uintptr_t retaddr,MemOp op)

{
  uc_struct_conflict15 *uc;
  hwaddr hVar1;
  MemoryRegion *mr;
  MemoryRegionSection *pMVar2;
  undefined4 in_register_00000014;
  CPUTriCoreState *__mptr;
  undefined4 in_register_00000084;
  
  uc = env->uc;
  pMVar2 = iotlb_to_section_tricore
                     ((CPUState *)&env[-0x32].cpu_model,iotlbentry->addr,iotlbentry->attrs);
  if (*(int *)((long)env[-4].irq + 0x34) != 0) {
    hVar1 = iotlbentry->addr;
    mr = pMVar2->mr;
    env[-4].irq[2] = (void *)CONCAT44(in_register_00000084,addr);
    memory_region_dispatch_write_tricore
              (uc,(MemoryRegion_conflict *)mr,(val & 0xffffffff) + (ulong)((uint)hVar1 & 0xffffc000)
               ,CONCAT44(in_register_00000014,mmu_idx),(MemOp)retaddr,iotlbentry->attrs);
    return;
  }
  cpu_io_recompile_tricore
            ((CPUState *)&env[-0x32].cpu_model,(uintptr_t)CONCAT44(in_register_00000084,addr));
}

Assistant:

static void io_writex(CPUArchState *env, CPUIOTLBEntry *iotlbentry,
                      int mmu_idx, uint64_t val, target_ulong addr,
                      uintptr_t retaddr, MemOp op)
{
    CPUState *cpu = env_cpu(env);
    struct uc_struct *uc = env->uc;
    hwaddr mr_offset;
    MemoryRegionSection *section;
    MemoryRegion *mr;
    MemTxResult r;

    section = iotlb_to_section(cpu, iotlbentry->addr, iotlbentry->attrs);
    mr = section->mr;
    mr_offset = (iotlbentry->addr & TARGET_PAGE_MASK) + addr;
    if (!cpu->can_do_io) {
        cpu_io_recompile(cpu, retaddr);
    }
    cpu->mem_io_pc = retaddr;

    r = memory_region_dispatch_write(uc, mr, mr_offset, val, op, iotlbentry->attrs);
    if (r != MEMTX_OK) {
#if 0
        hwaddr physaddr = mr_offset +
            section->offset_within_address_space -
            section->offset_within_region;

        cpu_transaction_failed(cpu, physaddr, addr, memop_size(op),
                               MMU_DATA_STORE, mmu_idx, iotlbentry->attrs, r,
                               retaddr);
#endif
    }
}